

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

color_quad<unsigned_char,_int> * __thiscall
crnlib::color_quad<unsigned_char,_int>::set
          (color_quad<unsigned_char,_int> *this,int red,int green,int blue,int alpha)

{
  int iVar1;
  int alpha_local;
  int blue_local;
  int green_local;
  int red_local;
  color_quad<unsigned_char,_int> *this_local;
  
  iVar1 = clamp<int>(red);
  (this->field_0).field_0.r = (uchar)iVar1;
  iVar1 = clamp<int>(green);
  (this->field_0).field_0.g = (uchar)iVar1;
  iVar1 = clamp<int>(blue);
  (this->field_0).field_0.b = (uchar)iVar1;
  iVar1 = clamp<int>(alpha);
  (this->field_0).field_0.a = (uchar)iVar1;
  return this;
}

Assistant:

inline color_quad& set(parameter_type red, parameter_type green, parameter_type blue, parameter_type alpha = component_traits::cMax)
        {
            r = static_cast<component_type>(clamp(red));
            g = static_cast<component_type>(clamp(green));
            b = static_cast<component_type>(clamp(blue));
            a = static_cast<component_type>(clamp(alpha));
            return *this;
        }